

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O3

string_t __thiscall
duckdb::HexIntegralOperator::Operation<unsigned_long,duckdb::string_t>
          (HexIntegralOperator *this,unsigned_long input,Vector *result)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  string_t target;
  undefined1 local_20 [16];
  
  if (this == (HexIntegralOperator *)0x0) {
    local_20 = (undefined1  [16])
               StringVector::EmptyString
                         ((StringVector *)input,(Vector *)&DAT_00000001,(idx_t)result);
    uVar1 = local_20._0_4_;
    pcVar3 = local_20._8_8_;
    if (uVar1 < 0xd) {
      pcVar3 = local_20 + 4;
    }
    *pcVar3 = '0';
  }
  else {
    uVar2 = (ulong)this >> 1 | (ulong)this;
    uVar2 = uVar2 >> 2 | uVar2;
    uVar2 = uVar2 >> 4 | uVar2;
    uVar2 = uVar2 >> 8 | uVar2;
    uVar2 = uVar2 >> 0x10 | uVar2;
    lVar4 = *(long *)(&DAT_0139a770 + ((uVar2 >> 0x20 | uVar2) * 0x3f79d71b4cb0a89 >> 0x3a) * 8);
    local_20 = (undefined1  [16])
               StringVector::EmptyString
                         ((StringVector *)input,(Vector *)(lVar4 + 4U >> 2),0x139a770);
    uVar1 = local_20._0_4_;
    pcVar3 = local_20._8_8_;
    if (uVar1 < 0xd) {
      pcVar3 = local_20 + 4;
    }
    lVar4 = (lVar4 + 4U & 0xfffffffffffffffc) - 4;
    do {
      *pcVar3 = "0123456789ABCDEF"[(uint)((ulong)this >> ((byte)lVar4 & 0x3f)) & 0xf];
      pcVar3 = pcVar3 + 1;
      lVar4 = lVar4 + -4;
    } while (lVar4 != -4);
  }
  uVar2 = (ulong)uVar1;
  if (uVar2 < 0xd) {
    switchD_00569a20::default(local_20 + uVar2 + 4,0,0xc - uVar2);
  }
  else {
    local_20._4_4_ = *(undefined4 *)local_20._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_20;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {

		auto num_leading_zero = CountZeros<uint64_t>::Leading(static_cast<uint64_t>(input));
		idx_t num_bits_to_check = 64 - num_leading_zero;
		D_ASSERT(num_bits_to_check <= sizeof(INPUT_TYPE) * 8);

		idx_t buffer_size = (num_bits_to_check + 3) / 4;

		// Special case: All bits are zero
		if (buffer_size == 0) {
			auto target = StringVector::EmptyString(result, 1);
			auto output = target.GetDataWriteable();
			*output = '0';
			target.Finalize();
			return target;
		}

		D_ASSERT(buffer_size > 0);
		auto target = StringVector::EmptyString(result, buffer_size);
		auto output = target.GetDataWriteable();

		WriteHexBytes(static_cast<uint64_t>(input), output, buffer_size);

		target.Finalize();
		return target;
	}